

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void js_async_generator_free(JSRuntime *rt,JSAsyncGeneratorData *s)

{
  list_head *plVar1;
  list_head *plVar2;
  
  plVar2 = (s->queue).next;
  while (plVar2 != &s->queue) {
    plVar1 = plVar2->next;
    JS_FreeValueRT(rt,*(JSValue *)&plVar2[1].next);
    JS_FreeValueRT(rt,*(JSValue *)&plVar2[2].next);
    JS_FreeValueRT(rt,*(JSValue *)&plVar2[3].next);
    JS_FreeValueRT(rt,*(JSValue *)&plVar2[4].next);
    (*(rt->mf).js_free)(&rt->malloc_state,plVar2);
    plVar2 = plVar1;
  }
  if ((s->state & ~JS_ASYNC_GENERATOR_STATE_SUSPENDED_YIELD) !=
      JS_ASYNC_GENERATOR_STATE_AWAITING_RETURN) {
    async_func_free(rt,&s->func_state);
  }
  (*(rt->mf).js_free)(&rt->malloc_state,s);
  return;
}

Assistant:

static void js_async_generator_free(JSRuntime *rt,
                                    JSAsyncGeneratorData *s)
{
    struct list_head *el, *el1;
    JSAsyncGeneratorRequest *req;

    list_for_each_safe(el, el1, &s->queue) {
        req = list_entry(el, JSAsyncGeneratorRequest, link);
        JS_FreeValueRT(rt, req->result);
        JS_FreeValueRT(rt, req->promise);
        JS_FreeValueRT(rt, req->resolving_funcs[0]);
        JS_FreeValueRT(rt, req->resolving_funcs[1]);
        js_free_rt(rt, req);
    }
    if (s->state != JS_ASYNC_GENERATOR_STATE_COMPLETED &&
        s->state != JS_ASYNC_GENERATOR_STATE_AWAITING_RETURN) {
        async_func_free(rt, &s->func_state);
    }
    js_free_rt(rt, s);
}